

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  string *local_7f0;
  string *local_7d8;
  string *local_7c0;
  string *local_7a8;
  string **local_528;
  string *fs_5;
  string *gs_5;
  string *tes_5;
  string *tcs_5;
  string *vs_5;
  string *cs_5;
  string source_5;
  string *fs_4;
  string *gs_4;
  string *tes_4;
  string *tcs_4;
  string *vs_4;
  string *cs_4;
  string source_4;
  string *fs_3;
  string *gs_3;
  string *tes_3;
  string *tcs_3;
  string *vs_3;
  string *cs_3;
  string source_3;
  string *fs_2;
  string *gs_2;
  string *tes_2;
  string *tcs_2;
  string *vs_2;
  string *cs_2;
  string source_2;
  string *fs_1;
  string *gs_1;
  string *tes_1;
  string *tcs_1;
  string *vs_1;
  string *cs_1;
  string source_1;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string source;
  string local_338 [8];
  string output_block_shader_source [6];
  string local_268 [8];
  string input_block_shader_source [3];
  allocator<char> local_1f9;
  string local_1f8 [8];
  string invalid_uniform_block_shader_source;
  string local_1c8 [8];
  string invalid_output_shader_source [6];
  string local_f8 [8];
  string invalid_input_shader_source [5];
  allocator<char> local_39;
  string local_38 [8];
  string invalid_buffer_shader_source;
  TestShaderType tested_shader_type_local;
  InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  invalid_buffer_shader_source.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "layout(std140) buffer MyBuffer\n{\n    float f;\n    int   i;\n    uint  ui;\n} myBuffers[2][2];\n\nvoid main()\n{\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  invalid_output_shader_source[5].field_2._M_local_buf[10] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"in  float input_variable",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\nout float output_variable",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[1].field_2._M_local_buf + 8),
             ";\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[2].field_2._M_local_buf + 8)," = input_variable"
             ,(allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[3].field_2._M_local_buf + 8),"[0][0];\n",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xb));
  invalid_output_shader_source[5].field_2._M_local_buf[10] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xf));
  invalid_uniform_block_shader_source.field_2._M_local_buf[9] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"out float output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[1].field_2._M_local_buf + 8),
             "[0][0] = 0.0;\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[2].field_2._M_local_buf + 8),
             "[0][1] = 1.0;\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[3].field_2._M_local_buf + 8),
             "[1][0] = 2.0;\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xb));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[4].field_2._M_local_buf + 8),"[1][1] = 3.0;\n",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 10));
  invalid_uniform_block_shader_source.field_2._M_local_buf[9] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,
             "layout(std140) uniform MyUniformBlock\n{\n    float f;\n    int   i;\n    uint  ui;\n} myUniformBlocks[2][2];\n\nvoid main()\n{\n"
             ,&local_1f9);
  std::allocator<char>::~allocator(&local_1f9);
  output_block_shader_source[5].field_2._M_local_buf[0xc] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_268,"in  InBlock {\n    float input_variable;\n} in_block",
             (allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\nout float output_variable;\n\nvoid main()\n{\n    output_variable = in_block"
             ,(allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source[1].field_2._M_local_buf + 8),
             "[0][0].input_variable;\n",
             (allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xd));
  output_block_shader_source[5].field_2._M_local_buf[0xc] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xf));
  source.field_2._M_local_buf[9] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"out OutBlock {\n    float output_variable;\n} out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\n\nvoid main()\n{\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[1].field_2._M_local_buf + 8),
             "[0][0].output_variable = 0.0;\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[2].field_2._M_local_buf + 8),
             "[0][1].output_variable = 1.0;\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[3].field_2._M_local_buf + 8),
             "[1][0].output_variable = 2.0;\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xb));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[4].field_2._M_local_buf + 8),
             "[1][1].output_variable = 3.0;\n",(allocator<char> *)(source.field_2._M_local_buf + 10)
            );
  source.field_2._M_local_buf[9] = '\0';
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&cs,local_38);
  switch(invalid_buffer_shader_source.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)&cs,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)&cs,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)&cs,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1e99);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)&cs,(string *)shader_end_abi_cxx11_);
  vs = (string *)empty_string_abi_cxx11_;
  tcs = (string *)default_vertex_shader_source_abi_cxx11_;
  tes = (string *)default_tc_shader_source_abi_cxx11_;
  gs = (string *)default_te_shader_source_abi_cxx11_;
  fs = (string *)default_geometry_shader_source_abi_cxx11_;
  source_1.field_2._8_8_ = default_fragment_shader_source_abi_cxx11_;
  switch(invalid_buffer_shader_source.field_2._12_4_) {
  case 0:
    source_1.field_2._8_8_ = &cs;
    break;
  case 1:
    tcs = (string *)&cs;
    break;
  case 2:
    vs = (string *)&cs;
    tcs = (string *)empty_string_abi_cxx11_;
    tes = (string *)empty_string_abi_cxx11_;
    gs = (string *)empty_string_abi_cxx11_;
    fs = (string *)empty_string_abi_cxx11_;
    source_1.field_2._8_8_ = empty_string_abi_cxx11_;
    break;
  case 3:
    fs = (string *)&cs;
    break;
  case 4:
    tes = (string *)&cs;
    break;
  case 5:
    gs = (string *)&cs;
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1e9b);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,tcs,tes,gs,fs,source_1.field_2._8_8_,vs,1,0);
  std::__cxx11::string::~string((string *)&cs);
  if (invalid_buffer_shader_source.field_2._12_4_ != 2) {
    std::__cxx11::string::string((string *)&cs_1);
    std::__cxx11::string::operator+=((string *)&cs_1,local_f8);
    if (((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
        (invalid_buffer_shader_source.field_2._12_4_ == 4)) ||
       (invalid_buffer_shader_source.field_2._12_4_ == 5)) {
      std::__cxx11::string::operator+=((string *)&cs_1,"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_1,(string *)(invalid_input_shader_source[0].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_1,"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_1,(string *)(invalid_input_shader_source[1].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_1,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_1,(string *)(invalid_input_shader_source[2].field_2._M_local_buf + 8));
    if ((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
       (invalid_buffer_shader_source.field_2._12_4_ == 5)) {
      std::__cxx11::string::operator+=((string *)&cs_1,"[0]");
    }
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_1,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_1,(string *)(invalid_input_shader_source[3].field_2._M_local_buf + 8));
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)&cs_1,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)&cs_1,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)&cs_1,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1ec9);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)&cs_1,(string *)shader_end_abi_cxx11_);
    vs_1 = (string *)empty_string_abi_cxx11_;
    tcs_1 = (string *)default_vertex_shader_source_abi_cxx11_;
    tes_1 = (string *)default_tc_shader_source_abi_cxx11_;
    gs_1 = (string *)default_te_shader_source_abi_cxx11_;
    fs_1 = (string *)default_geometry_shader_source_abi_cxx11_;
    source_2.field_2._8_8_ = default_fragment_shader_source_abi_cxx11_;
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      source_2.field_2._8_8_ = &cs_1;
      break;
    case 1:
      tcs_1 = (string *)&cs_1;
      break;
    case 2:
      vs_1 = (string *)&cs_1;
      tcs_1 = (string *)empty_string_abi_cxx11_;
      tes_1 = (string *)empty_string_abi_cxx11_;
      gs_1 = (string *)empty_string_abi_cxx11_;
      fs_1 = (string *)empty_string_abi_cxx11_;
      source_2.field_2._8_8_ = empty_string_abi_cxx11_;
      break;
    case 3:
      fs_1 = (string *)&cs_1;
      break;
    case 4:
      tes_1 = (string *)&cs_1;
      break;
    case 5:
      gs_1 = (string *)&cs_1;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1ecb);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs_1,tes_1,gs_1,fs_1,source_2.field_2._8_8_,vs_1,1,0);
    std::__cxx11::string::~string((string *)&cs_1);
  }
  if (invalid_buffer_shader_source.field_2._12_4_ != 2) {
    std::__cxx11::string::string((string *)&cs_2);
    std::__cxx11::string::operator+=((string *)&cs_2,local_1c8);
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_2,"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_2,(string *)(invalid_output_shader_source[0].field_2._M_local_buf + 8))
    ;
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_2,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_2,(string *)(invalid_output_shader_source[1].field_2._M_local_buf + 8))
    ;
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_2,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_2,(string *)(invalid_output_shader_source[2].field_2._M_local_buf + 8))
    ;
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_2,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_2,(string *)(invalid_output_shader_source[3].field_2._M_local_buf + 8))
    ;
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_2,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_2,(string *)(invalid_output_shader_source[4].field_2._M_local_buf + 8))
    ;
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)&cs_2,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)&cs_2,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)&cs_2,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1ef8);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)&cs_2,(string *)shader_end_abi_cxx11_);
    vs_2 = (string *)empty_string_abi_cxx11_;
    tcs_2 = (string *)default_vertex_shader_source_abi_cxx11_;
    tes_2 = (string *)default_tc_shader_source_abi_cxx11_;
    gs_2 = (string *)default_te_shader_source_abi_cxx11_;
    fs_2 = (string *)default_geometry_shader_source_abi_cxx11_;
    source_3.field_2._8_8_ = default_fragment_shader_source_abi_cxx11_;
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      source_3.field_2._8_8_ = &cs_2;
      break;
    case 1:
      tcs_2 = (string *)&cs_2;
      break;
    case 2:
      vs_2 = (string *)&cs_2;
      tcs_2 = (string *)empty_string_abi_cxx11_;
      tes_2 = (string *)empty_string_abi_cxx11_;
      gs_2 = (string *)empty_string_abi_cxx11_;
      fs_2 = (string *)empty_string_abi_cxx11_;
      source_3.field_2._8_8_ = empty_string_abi_cxx11_;
      break;
    case 3:
      fs_2 = (string *)&cs_2;
      break;
    case 4:
      tes_2 = (string *)&cs_2;
      break;
    case 5:
      gs_2 = (string *)&cs_2;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1efa);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs_2,tes_2,gs_2,fs_2,source_3.field_2._8_8_,vs_2,1,0);
    std::__cxx11::string::~string((string *)&cs_2);
  }
  std::__cxx11::string::string((string *)&cs_3,local_1f8);
  switch(invalid_buffer_shader_source.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)&cs_3,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)&cs_3,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)&cs_3,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1f01);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)&cs_3,(string *)shader_end_abi_cxx11_);
  vs_3 = (string *)empty_string_abi_cxx11_;
  tcs_3 = (string *)default_vertex_shader_source_abi_cxx11_;
  tes_3 = (string *)default_tc_shader_source_abi_cxx11_;
  gs_3 = (string *)default_te_shader_source_abi_cxx11_;
  fs_3 = (string *)default_geometry_shader_source_abi_cxx11_;
  source_4.field_2._8_8_ = default_fragment_shader_source_abi_cxx11_;
  switch(invalid_buffer_shader_source.field_2._12_4_) {
  case 0:
    source_4.field_2._8_8_ = &cs_3;
    break;
  case 1:
    tcs_3 = (string *)&cs_3;
    break;
  case 2:
    vs_3 = (string *)&cs_3;
    tcs_3 = (string *)empty_string_abi_cxx11_;
    tes_3 = (string *)empty_string_abi_cxx11_;
    gs_3 = (string *)empty_string_abi_cxx11_;
    fs_3 = (string *)empty_string_abi_cxx11_;
    source_4.field_2._8_8_ = empty_string_abi_cxx11_;
    break;
  case 3:
    fs_3 = (string *)&cs_3;
    break;
  case 4:
    tes_3 = (string *)&cs_3;
    break;
  case 5:
    gs_3 = (string *)&cs_3;
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1f03);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,tcs_3,tes_3,gs_3,fs_3,source_4.field_2._8_8_,vs_3,1,0);
  std::__cxx11::string::~string((string *)&cs_3);
  if ((invalid_buffer_shader_source.field_2._12_4_ != 1) &&
     (invalid_buffer_shader_source.field_2._12_4_ != 2)) {
    std::__cxx11::string::string((string *)&cs_4);
    std::__cxx11::string::operator+=((string *)&cs_4,local_268);
    if ((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
       ((invalid_buffer_shader_source.field_2._12_4_ == 4 ||
        (invalid_buffer_shader_source.field_2._12_4_ == 5)))) {
      std::__cxx11::string::operator+=((string *)&cs_4,"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_4,(string *)(input_block_shader_source[0].field_2._M_local_buf + 8));
    if (((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
        (invalid_buffer_shader_source.field_2._12_4_ == 4)) ||
       (invalid_buffer_shader_source.field_2._12_4_ == 5)) {
      std::__cxx11::string::operator+=((string *)&cs_4,"[0]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_4,(string *)(input_block_shader_source[1].field_2._M_local_buf + 8));
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)&cs_4,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)&cs_4,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)&cs_4,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1f20);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)&cs_4,(string *)shader_end_abi_cxx11_);
    vs_4 = (string *)empty_string_abi_cxx11_;
    tcs_4 = (string *)default_vertex_shader_source_abi_cxx11_;
    tes_4 = (string *)default_tc_shader_source_abi_cxx11_;
    gs_4 = (string *)default_te_shader_source_abi_cxx11_;
    fs_4 = (string *)default_geometry_shader_source_abi_cxx11_;
    source_5.field_2._8_8_ = default_fragment_shader_source_abi_cxx11_;
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      source_5.field_2._8_8_ = &cs_4;
      break;
    case 1:
      tcs_4 = (string *)&cs_4;
      break;
    case 2:
      vs_4 = (string *)&cs_4;
      tcs_4 = (string *)empty_string_abi_cxx11_;
      tes_4 = (string *)empty_string_abi_cxx11_;
      gs_4 = (string *)empty_string_abi_cxx11_;
      fs_4 = (string *)empty_string_abi_cxx11_;
      source_5.field_2._8_8_ = empty_string_abi_cxx11_;
      break;
    case 3:
      fs_4 = (string *)&cs_4;
      break;
    case 4:
      tes_4 = (string *)&cs_4;
      break;
    case 5:
      gs_4 = (string *)&cs_4;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1f23);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs_4,tes_4,gs_4,fs_4,source_5.field_2._8_8_,vs_4,1,0);
    std::__cxx11::string::~string((string *)&cs_4);
  }
  if ((invalid_buffer_shader_source.field_2._12_4_ != 0) &&
     (invalid_buffer_shader_source.field_2._12_4_ != 2)) {
    std::__cxx11::string::string((string *)&cs_5);
    std::__cxx11::string::operator=((string *)&cs_5,local_338);
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_5,"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_5,(string *)(output_block_shader_source[0].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_5,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_5,(string *)(output_block_shader_source[1].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_5,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_5,(string *)(output_block_shader_source[2].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_5,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_5,(string *)(output_block_shader_source[3].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)&cs_5,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)&cs_5,(string *)(output_block_shader_source[4].field_2._M_local_buf + 8));
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)&cs_5,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)&cs_5,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)&cs_5,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1f51);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)&cs_5,(string *)shader_end_abi_cxx11_);
    vs_5 = (string *)empty_string_abi_cxx11_;
    tcs_5 = (string *)default_vertex_shader_source_abi_cxx11_;
    tes_5 = (string *)default_tc_shader_source_abi_cxx11_;
    gs_5 = (string *)default_te_shader_source_abi_cxx11_;
    fs_5 = (string *)default_geometry_shader_source_abi_cxx11_;
    local_528 = (string **)default_fragment_shader_source_abi_cxx11_;
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      local_528 = &cs_5;
      break;
    case 1:
      tcs_5 = (string *)&cs_5;
      break;
    case 2:
      vs_5 = (string *)&cs_5;
      tcs_5 = (string *)empty_string_abi_cxx11_;
      tes_5 = (string *)empty_string_abi_cxx11_;
      gs_5 = (string *)empty_string_abi_cxx11_;
      fs_5 = (string *)empty_string_abi_cxx11_;
      local_528 = (string **)empty_string_abi_cxx11_;
      break;
    case 3:
      fs_5 = (string *)&cs_5;
      break;
    case 4:
      tes_5 = (string *)&cs_5;
      break;
    case 5:
      gs_5 = (string *)&cs_5;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1f54);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs_5,tes_5,gs_5,fs_5,local_528,vs_5,1,0);
    std::__cxx11::string::~string((string *)&cs_5);
  }
  local_7a8 = (string *)(output_block_shader_source[5].field_2._M_local_buf + 8);
  do {
    local_7a8 = local_7a8 + -0x20;
    std::__cxx11::string::~string(local_7a8);
  } while (local_7a8 != local_338);
  local_7c0 = (string *)(input_block_shader_source[2].field_2._M_local_buf + 8);
  do {
    local_7c0 = local_7c0 + -0x20;
    std::__cxx11::string::~string(local_7c0);
  } while (local_7c0 != local_268);
  std::__cxx11::string::~string(local_1f8);
  local_7d8 = (string *)(invalid_output_shader_source[5].field_2._M_local_buf + 8);
  do {
    local_7d8 = local_7d8 + -0x20;
    std::__cxx11::string::~string(local_7d8);
  } while (local_7d8 != local_1c8);
  local_7f0 = (string *)(invalid_input_shader_source[4].field_2._M_local_buf + 8);
  do {
    local_7f0 = local_7f0 + -0x20;
    std::__cxx11::string::~string(local_7f0);
  } while (local_7f0 != local_f8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void InteractionInterfaceArrays<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	/* Shader source with invalid buffer (buffer cannot be of arrays of arrays type). */
	const std::string invalid_buffer_shader_source = "layout(std140) buffer MyBuffer\n"
													 "{\n"
													 "    float f;\n"
													 "    int   i;\n"
													 "    uint  ui;\n"
													 "} myBuffers[2][2];\n\n"
													 "void main()\n"
													 "{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string invalid_input_shader_source[] = { "in  float input_variable", "[2][2];\n"
																					"out float output_variable",
														";\n\n"
														"void main()\n"
														"{\n"
														"    output_variable",
														" = input_variable", "[0][0];\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string invalid_output_shader_source[] = { "out float output_variable", "[2][2];\n\n"
																					  "void main()\n"
																					  "{\n"
																					  "    output_variable",
														 "[0][0] = 0.0;\n"
														 "    output_variable",
														 "[0][1] = 1.0;\n"
														 "    output_variable",
														 "[1][0] = 2.0;\n"
														 "    output_variable",
														 "[1][1] = 3.0;\n" };
	/* Shader source with invalid uniform block (uniform block cannot be of arrays of arrays type). */
	const std::string invalid_uniform_block_shader_source = "layout(std140) uniform MyUniformBlock\n"
															"{\n"
															"    float f;\n"
															"    int   i;\n"
															"    uint  ui;\n"
															"} myUniformBlocks[2][2];\n\n"
															"void main()\n"
															"{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string input_block_shader_source[] = { "in  InBlock {\n"
													  "    float input_variable;\n"
													  "} in_block",

													  "[2][2];\n"
													  "out float output_variable;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    output_variable = in_block",
													  "[0][0].input_variable;\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string output_block_shader_source[] = { "out OutBlock {\n"
													   "    float output_variable;\n"
													   "} out_block",
													   "[2][2];\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    out_block",
													   "[0][0].output_variable = 0.0;\n"
													   "    out_block",
													   "[0][1].output_variable = 1.0;\n"
													   "    out_block",
													   "[1][0].output_variable = 2.0;\n"
													   "    out_block",
													   "[1][1].output_variable = 3.0;\n" };

	/* Verify that buffer arrays of arrays type is rejected. */
	{
		std::string source = invalid_buffer_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that INPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_input_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += invalid_input_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_input_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[3];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[4];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that OUTPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_output_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_output_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that uniform block arrays of arrays type is rejected. */
	{
		std::string source = invalid_uniform_block_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of input blocks are accepted */
	if ((TestCaseBase<API>::VERTEX_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source += input_block_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += input_block_shader_source[1];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		source += input_block_shader_source[2];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of output blocks are accepted */
	if ((TestCaseBase<API>::FRAGMENT_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source = output_block_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += output_block_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}
}